

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O2

bool httplib::detail::keep_alive(socket_t sock,time_t keep_alive_timeout_sec)

{
  rep in_RAX;
  long lVar1;
  ssize_t sVar2;
  long lVar3;
  duration<long,_std::ratio<1L,_1000L>_> local_38;
  
  local_38.__r = in_RAX;
  lVar1 = std::chrono::_V2::steady_clock::now();
  while( true ) {
    sVar2 = select_read(sock,0,10000);
    if (sVar2 < 0) {
      return false;
    }
    if (sVar2 != 0) break;
    lVar3 = std::chrono::_V2::steady_clock::now();
    if (keep_alive_timeout_sec * 1000 < (lVar3 - lVar1) / 1000000) {
      return false;
    }
    local_38.__r = 1;
    std::this_thread::sleep_for<long,std::ratio<1l,1000l>>(&local_38);
  }
  return true;
}

Assistant:

inline bool keep_alive(socket_t sock, time_t keep_alive_timeout_sec) {
  using namespace std::chrono;
  auto start = steady_clock::now();
  while (true) {
    auto val = select_read(sock, 0, 10000);
    if (val < 0) {
      return false;
    } else if (val == 0) {
      auto current = steady_clock::now();
      auto duration = duration_cast<milliseconds>(current - start);
      auto timeout = keep_alive_timeout_sec * 1000;
      if (duration.count() > timeout) { return false; }
      std::this_thread::sleep_for(std::chrono::milliseconds(1));
    } else {
      return true;
    }
  }
}